

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_alt_helpers.cpp
# Opt level: O3

int mbedtls_rsa_deduce_private_exponent(mbedtls_mpi *P,mbedtls_mpi *Q,mbedtls_mpi *E,mbedtls_mpi *D)

{
  int iVar1;
  int iVar2;
  mbedtls_mpi K;
  mbedtls_mpi L;
  mbedtls_mpi local_50;
  mbedtls_mpi local_40;
  
  iVar2 = -4;
  if (D != (mbedtls_mpi *)0x0) {
    iVar1 = mbedtls_mpi_cmp_int(D,0);
    if (iVar1 == 0) {
      iVar1 = mbedtls_mpi_cmp_int(P,1);
      if (0 < iVar1) {
        iVar1 = mbedtls_mpi_cmp_int(Q,1);
        if (0 < iVar1) {
          iVar1 = mbedtls_mpi_cmp_int(E,0);
          if (iVar1 != 0) {
            mbedtls_mpi_init(&local_50);
            mbedtls_mpi_init(&local_40);
            iVar2 = mbedtls_mpi_sub_int(&local_50,P,1);
            if (iVar2 == 0) {
              iVar2 = mbedtls_mpi_sub_int(&local_40,Q,1);
              if (iVar2 == 0) {
                iVar2 = mbedtls_mpi_gcd(D,&local_50,&local_40);
                if (iVar2 == 0) {
                  iVar2 = mbedtls_mpi_mul_mpi(&local_50,&local_50,&local_40);
                  if (iVar2 == 0) {
                    iVar2 = mbedtls_mpi_div_mpi(&local_50,(mbedtls_mpi *)0x0,&local_50,D);
                    if (iVar2 == 0) {
                      iVar2 = mbedtls_mpi_inv_mod(D,E,&local_50);
                    }
                  }
                }
              }
            }
            mbedtls_mpi_free(&local_50);
            mbedtls_mpi_free(&local_40);
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_rsa_deduce_private_exponent(mbedtls_mpi const *P,
                                        mbedtls_mpi const *Q,
                                        mbedtls_mpi const *E,
                                        mbedtls_mpi *D)
{
    int ret = 0;
    mbedtls_mpi K, L;

    if (D == NULL || mbedtls_mpi_cmp_int(D, 0) != 0) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    if (mbedtls_mpi_cmp_int(P, 1) <= 0 ||
        mbedtls_mpi_cmp_int(Q, 1) <= 0 ||
        mbedtls_mpi_cmp_int(E, 0) == 0) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    mbedtls_mpi_init(&K);
    mbedtls_mpi_init(&L);

    /* Temporarily put K := P-1 and L := Q-1 */
    MBEDTLS_MPI_CHK(mbedtls_mpi_sub_int(&K, P, 1));
    MBEDTLS_MPI_CHK(mbedtls_mpi_sub_int(&L, Q, 1));

    /* Temporarily put D := gcd(P-1, Q-1) */
    MBEDTLS_MPI_CHK(mbedtls_mpi_gcd(D, &K, &L));

    /* K := LCM(P-1, Q-1) */
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&K, &K, &L));
    MBEDTLS_MPI_CHK(mbedtls_mpi_div_mpi(&K, NULL, &K, D));

    /* Compute modular inverse of E in LCM(P-1, Q-1) */
    MBEDTLS_MPI_CHK(mbedtls_mpi_inv_mod(D, E, &K));

cleanup:

    mbedtls_mpi_free(&K);
    mbedtls_mpi_free(&L);

    return ret;
}